

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

int __thiscall BenevolentBotStrategy::fortifyArmyCount(BenevolentBotStrategy *this)

{
  int iVar1;
  int iVar2;
  
  iVar2 = *((this->super_PlayerStrategy).from)->pNumberOfTroops -
          *((this->super_PlayerStrategy).to)->pNumberOfTroops;
  iVar1 = 0;
  if (-2 < iVar2) {
    iVar1 = iVar2 / 2;
  }
  return iVar1;
}

Assistant:

int BenevolentBotStrategy::fortifyArmyCount() {
    int move = from->getNumberOfTroops();
    move = (move - to->getNumberOfTroops()) / 2;
    //bug fix : so that it doesnt try to move a negative number of armies
    if(move < 0){
        return 0;
    }
    return move;
}